

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

void Vec_StrPutF_(Vec_Str_t *vOut,float Val)

{
  float Val_local;
  Vec_Str_t *vOut_local;
  
  Vec_StrPutF(vOut,Val);
  return;
}

Assistant:

static inline void Vec_StrPutF_( Vec_Str_t * vOut, float Val )   { Vec_StrPutF( vOut, Val );  }